

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::warning<std::__cxx11::string_const&>
          (Reporter *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  size_t sVar1;
  basic_string_view<char> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  ostream *in_stack_ffffffffffffff70;
  basic_string_view<char> in_stack_ffffffffffffff78;
  
  sVar1 = std::char_traits<char>::length((char_type *)0x23c02c);
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff70,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff68);
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::char_traits<char>,std::allocator<char>>(in_RDI,in_stack_ffffffffffffff38);
  ::fmt::v10::print<>(in_stack_ffffffffffffff70,(format_string<>)in_stack_ffffffffffffff78);
  std::char_traits<char>::length((char_type *)0x23c0fe);
  ::fmt::v10::print<>(in_stack_ffffffffffffff70,(format_string<>)in_stack_ffffffffffffff78);
  return;
}

Assistant:

void warning(Args&&... args) {
        fmt::print(std::cerr, "{} warning: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
    }